

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O3

int __thiscall Ptex::v2_2::PtexReader::open(PtexReader *this,char *__file,int __oflag,...)

{
  uint uVar1;
  char *pcVar2;
  PtexErrorHandler *pPVar3;
  uint64_t uVar4;
  PtexErrorHandler PVar5;
  int iVar6;
  undefined4 extraout_var;
  ulong uVar7;
  uint64_t uVar8;
  ostream *poVar9;
  size_t sVar10;
  long lVar11;
  uint size;
  size_type __new_size;
  TempErrorHandler tempErr;
  long *local_1d8 [2];
  long local_1c8 [2];
  PtexErrorHandler local_1b8;
  undefined1 *local_1b0;
  _func_int *local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  ios_base local_138 [264];
  
  pthread_mutex_lock((pthread_mutex_t *)&this->readlock);
  if (this->_needToOpen != false) {
    pcVar2 = (char *)(this->_path)._M_string_length;
    strlen(__file);
    std::__cxx11::string::_M_replace((ulong)&this->_path,0,pcVar2,(ulong)__file);
    iVar6 = (*this->_io->_vptr_PtexInputHandler[2])(this->_io,__file);
    this->_fp = (Handle)CONCAT44(extraout_var,iVar6);
    if ((Handle)CONCAT44(extraout_var,iVar6) == (Handle)0x0) {
      local_1b8._vptr_PtexErrorHandler = &local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,"Can\'t open ptex file: ","");
      std::__cxx11::string::append((char *)&local_1b8);
      std::__cxx11::string::append((char *)&local_1b8);
      (*this->_io->_vptr_PtexInputHandler[6])();
      std::__cxx11::string::append((char *)&local_1b8);
      PVar5._vptr_PtexErrorHandler = local_1b8._vptr_PtexErrorHandler;
      pcVar2 = *(char **)(___oflag + 8);
      strlen((char *)local_1b8._vptr_PtexErrorHandler);
      std::__cxx11::string::_M_replace((ulong)___oflag,0,pcVar2,(ulong)PVar5._vptr_PtexErrorHandler)
      ;
      this->_ok = false;
    }
    else {
      (this->_header).leveldatasize = 0;
      (this->_header).metadatazipsize = 0;
      (this->_header).metadatamemsize = 0;
      (this->_header).faceinfosize = 0;
      (this->_header).constdatasize = 0;
      (this->_header).levelinfosize = 0;
      (this->_header).minorversion = 0;
      (this->_header).alphachan = 0;
      (this->_header).nchannels = 0;
      (this->_header).nlevels = 0;
      (this->_header).nfaces = 0;
      (this->_header).extheadersize = 0;
      (this->_header).magic = 0;
      (this->_header).version = 0;
      (this->_header).meshtype = 0;
      (this->_header).datatype = 0;
      readBlock(this,&this->_header,0x40,true);
      if ((this->_header).magic == 0x78657450) {
        if ((this->_header).version == 1) {
          __new_size = (ulong)(this->_header).nchannels *
                       (long)*(int *)(DataSize(Ptex::v2_2::DataType)::sizes +
                                     (ulong)(this->_header).datatype * 4);
          this->_pixelsize = (int)__new_size;
          std::vector<char,_std::allocator<char>_>::resize(&this->_errorPixel,__new_size);
          local_1b8._vptr_PtexErrorHandler = (_func_int **)&PTR__TempErrorHandler_031e8c30;
          local_1a8 = (_func_int *)0x0;
          local_1a0 = 0;
          pPVar3 = this->_err;
          this->_err = &local_1b8;
          (this->_extheader).ubordermode = 0;
          (this->_extheader).pad = 0;
          (this->_extheader).vbordermode = 0;
          (this->_extheader).edgefiltermode = 0;
          (this->_extheader).lmdheaderzipsize = 0;
          (this->_extheader).lmdheadermemsize = 0;
          (this->_extheader).lmddatasize = 0;
          (this->_extheader).editdatasize = 0;
          (this->_extheader).editdatapos = 0;
          uVar1 = (this->_header).extheadersize;
          size = 0x28;
          if (uVar1 < 0x28) {
            size = uVar1;
          }
          local_1b0 = &local_1a0;
          readBlock(this,&this->_extheader,size,true);
          uVar1 = (this->_header).faceinfosize;
          uVar7 = (ulong)((this->_header).extheadersize + 0x40);
          this->_faceinfopos = uVar7;
          lVar11 = uVar1 + uVar7;
          this->_constdatapos = lVar11;
          lVar11 = (ulong)(this->_header).constdatasize + lVar11;
          this->_levelinfopos = lVar11;
          lVar11 = (ulong)(this->_header).levelinfosize + lVar11;
          this->_leveldatapos = lVar11;
          lVar11 = lVar11 + (this->_header).leveldatasize;
          this->_metadatapos = lVar11;
          uVar7 = (ulong)(this->_header).metadatazipsize;
          this->_lmdheaderpos = uVar7 + lVar11 + 8;
          lVar11 = (ulong)(this->_extheader).lmdheaderzipsize + lVar11 + uVar7 + 8;
          this->_lmddatapos = lVar11;
          uVar8 = lVar11 + (this->_extheader).lmddatasize;
          uVar4 = (this->_extheader).editdatapos;
          if ((long)uVar8 < (long)uVar4) {
            uVar8 = uVar4;
          }
          this->_editdatapos = uVar8;
          readFaceInfo(this);
          readConstData(this);
          readLevelInfo(this);
          readEditData(this);
          this->_baseMemUsed = this->_memUsed;
          this->_err = pPVar3;
          iVar6 = (int)CONCAT71((int7)((ulong)pPVar3 >> 8),this->_ok);
          if (this->_ok == false) {
            std::__cxx11::string::_M_assign(___oflag);
            closeFP(this);
          }
          else {
            this->_needToOpen = false;
          }
          local_1b8._vptr_PtexErrorHandler = (_func_int **)&PTR__TempErrorHandler_031e8c30;
          if (local_1b0 != &local_1a0) {
            operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
          }
          goto LAB_005dd14a;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Unsupported ptex file version (",0x1f);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"): ",3);
        if (__file == (char *)0x0) {
          std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
        }
        else {
          sVar10 = strlen(__file);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,__file,sVar10);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=(___oflag,(string *)local_1d8);
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
        this->_ok = false;
        closeFP(this);
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        std::ios_base::~ios_base(local_138);
        goto LAB_005dd148;
      }
      local_1b8._vptr_PtexErrorHandler = &local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"Not a ptex file: ","");
      std::__cxx11::string::append((char *)&local_1b8);
      PVar5._vptr_PtexErrorHandler = local_1b8._vptr_PtexErrorHandler;
      pcVar2 = *(char **)(___oflag + 8);
      strlen((char *)local_1b8._vptr_PtexErrorHandler);
      std::__cxx11::string::_M_replace((ulong)___oflag,0,pcVar2,(ulong)PVar5._vptr_PtexErrorHandler)
      ;
      this->_ok = false;
      closeFP(this);
    }
    if (local_1b8._vptr_PtexErrorHandler != &local_1a8) {
      operator_delete(local_1b8._vptr_PtexErrorHandler,(ulong)(local_1a8 + 1));
    }
  }
LAB_005dd148:
  iVar6 = 0;
LAB_005dd14a:
  pthread_mutex_unlock((pthread_mutex_t *)&this->readlock);
  return iVar6;
}

Assistant:

bool PtexReader::open(const char* pathArg, Ptex::String& error)
{
    AutoMutex locker(readlock);
    if (!needToOpen()) return false;

    if (!LittleEndian()) {
        error = "Ptex library doesn't currently support big-endian cpu's";
        return 0;
    }
    _path = pathArg;
    _fp = _io->open(pathArg);
    if (!_fp) {
        std::string errstr = "Can't open ptex file: ";
        errstr += pathArg; errstr += "\n"; errstr += _io->lastError();
        error = errstr.c_str();
        _ok = 0;
        return 0;
    }
    memset(&_header, 0, sizeof(_header));
    readBlock(&_header, HeaderSize);
    if (_header.magic != Magic) {
        std::string errstr = "Not a ptex file: "; errstr += pathArg;
        error = errstr.c_str();
        _ok = 0;
        closeFP();
        return 0;
    }
    if (_header.version != 1) {
        std::stringstream s;
        s << "Unsupported ptex file version ("<< _header.version << "): " << pathArg;
        error = s.str();
        _ok = 0;
        closeFP();
        return 0;
    }
    _pixelsize = _header.pixelSize();
    _errorPixel.resize(_pixelsize);

    // install temp error handler to capture error (to return in error param)
    TempErrorHandler tempErr;
    PtexErrorHandler* prevErr = _err;
    _err = &tempErr;

    // read extended header
    memset(&_extheader, 0, sizeof(_extheader));
    readBlock(&_extheader, PtexUtils::min(uint32_t(ExtHeaderSize), _header.extheadersize));

    // compute offsets of various blocks
    FilePos pos = HeaderSize + _header.extheadersize;
    _faceinfopos = pos;   pos += _header.faceinfosize;
    _constdatapos = pos;  pos += _header.constdatasize;
    _levelinfopos = pos;  pos += _header.levelinfosize;
    _leveldatapos = pos;  pos += _header.leveldatasize;
    _metadatapos = pos;   pos += _header.metadatazipsize;
                          pos += sizeof(uint64_t); // compatibility barrier
    _lmdheaderpos = pos;  pos += _extheader.lmdheaderzipsize;
    _lmddatapos = pos;    pos += _extheader.lmddatasize;

    // edit data may not start immediately if additional sections have been added
    // use value from extheader if present (and > pos)
    _editdatapos = PtexUtils::max(FilePos(_extheader.editdatapos), pos);

    // read basic file info
    readFaceInfo();
    readConstData();
    readLevelInfo();
    readEditData();
    _baseMemUsed = _memUsed;

    // restore error handler
    _err = prevErr;

    // an error occurred while reading the file
    if (!_ok) {
        error = tempErr.getErrorString();
        closeFP();
        return 0;
    }
    AtomicStore(&_needToOpen, false);
    return true;
}